

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

bool __thiscall
QItemSelectionModel::rowIntersectsSelection(QItemSelectionModel *this,int row,QModelIndex *parent)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *this_00;
  long lVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  parameter_type pQVar7;
  QItemSelectionRange *pQVar8;
  bool bVar9;
  QItemSelectionRange *this_01;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QArrayDataPointer<QItemSelectionRange> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             *)(lVar1 + 0x78);
  pQVar7 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value(this_00);
  if ((pQVar7 == (parameter_type)0x0) ||
     ((((-1 < parent->r && (-1 < parent->c)) && ((parent->m).ptr != (QAbstractItemModel *)0x0)) &&
      (pQVar7 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                ::value(this_00), pQVar7 != (parent->m).ptr)))) {
    bVar9 = false;
  }
  else {
    local_50.d = *(Data **)(lVar1 + 0x80);
    local_50.ptr = *(QItemSelectionRange **)(lVar1 + 0x88);
    local_50.size = *(long *)(lVar1 + 0x90);
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QItemSelection::merge
              ((QItemSelection *)&local_50,(QItemSelection *)(lVar1 + 0x98),
               (QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>)
               ((QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> *)(lVar1 + 0xb8))->
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>);
    if ((((local_50.size == 0) ||
         (QPersistentModelIndex::parent(&local_68,&(local_50.ptr)->tl), local_68.r != parent->r)) ||
        ((local_68.c != parent->c ||
         ((local_68.i != parent->i || (local_68.m.ptr != (parent->m).ptr)))))) ||
       (local_50.size == 0)) {
      bVar9 = false;
    }
    else {
      pQVar8 = local_50.ptr + local_50.size;
      this_01 = local_50.ptr;
      do {
        iVar3 = QPersistentModelIndex::row(&this_01->tl);
        iVar4 = QPersistentModelIndex::row(&this_01->br);
        if ((iVar3 <= row) && (row <= iVar4)) {
          uVar5 = QPersistentModelIndex::column(&this_01->tl);
          iVar3 = QPersistentModelIndex::column(&this_01->br);
          if ((int)uVar5 <= iVar3) {
            do {
              QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::value(this_00);
              pQVar2 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
              (*(pQVar2->super_QObject)._vptr_QObject[0xc])
                        (&local_68,pQVar2,row,(ulong)uVar5,parent);
              if ((local_68.m.ptr != (QAbstractItemModel *)0x0) &&
                 (uVar6 = (*((local_68.m.ptr)->super_QObject)._vptr_QObject[0x27])
                                    (local_68.m.ptr,&local_68), (~uVar6 & 0x21) == 0)) {
                bVar9 = true;
                goto LAB_0045fa06;
              }
              uVar5 = uVar5 + 1;
            } while (iVar3 + 1U != uVar5);
          }
        }
        this_01 = this_01 + 1;
        bVar9 = false;
      } while (this_01 != pQVar8);
    }
LAB_0045fa06:
    QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool QItemSelectionModel::rowIntersectsSelection(int row, const QModelIndex &parent) const
{
    Q_D(const QItemSelectionModel);
    if (!d->model.value())
        return false;
    if (parent.isValid() && d->model != parent.model())
         return false;

    QItemSelection sel = d->ranges;
    sel.merge(d->currentSelection, d->currentCommand);
    if (sel.isEmpty() || sel.constFirst().parent() != parent)
        return false;

    for (const QItemSelectionRange &range : std::as_const(sel)) {
        int top = range.top();
        int bottom = range.bottom();
        if (top <= row && bottom >= row) {
            int left = range.left();
            int right = range.right();
            for (int j = left; j <= right; j++) {
                if (isSelectableAndEnabled(d->model->index(row, j, parent).flags()))
                    return true;
            }
        }
    }

    return false;
}